

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O1

int Granulator::GetFloatBufferCallback
              (UnityAudioEffectState *state,char *name,float *buffer,int numsamples)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  undefined1 *puVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  float __x;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  MutexScopeLock mutexScope;
  MutexScopeLock local_40;
  ulong local_38;
  
  pvVar2 = (state->field_0).field_0.effectdata;
  if (pvVar2 == (void *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,
                  "T *UnityAudioEffectState::GetEffectData() const [T = Granulator::EffectData]");
  }
  if ((state->field_0).field_0.internal == (void *)0x0) {
    __assert_fail("internal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfe,
                  "T *UnityAudioEffectState::GetEffectData() const [T = Granulator::EffectData]");
  }
  iVar3 = strncmp(name,"Waveform",8);
  if (iVar3 != 0) {
    return 0;
  }
  uVar10 = (uint)*(float *)((long)pvVar2 + 0x30);
  local_40.mutex = (Mutex *)0x0;
  if ((int)uVar10 < 0) {
    puVar5 = (undefined1 *)((long)pvVar2 + 0x4ed0);
  }
  else {
    local_40.mutex = (Mutex *)sampleMutex;
    Mutex::Lock((Mutex *)sampleMutex);
    if (GetGranulatorSample(int)::initialized == '\0') {
      memset(GetGranulatorSample(int)::samples,0,0x4280);
      GetGranulatorSample(int)::initialized = '\x01';
    }
    puVar5 = GetGranulatorSample(int)::samples + (ulong)uVar10 * 0x428;
  }
  iVar3 = *(int *)(puVar5 + 0x10);
  if (iVar3 != 0) {
    uVar1 = *(uint *)(puVar5 + 0x14);
    if (uVar1 != 0) {
      iVar4 = uVar1 - 1;
      if (name[8] + -0x30 < (int)uVar1) {
        iVar4 = name[8] + -0x30;
      }
      iVar9 = 0;
      if ((int)uVar10 < 0) {
        iVar9 = *(int *)((long)pvVar2 + 0x38);
      }
      local_38 = (ulong)uVar1;
      if (0 < numsamples) {
        lVar7 = (long)iVar4 * 4 + *(long *)(puVar5 + 8);
        fVar12 = (float)(iVar3 + -2) / (float)numsamples;
        if (puVar5 != (undefined1 *)((long)pvVar2 + 0x4ed0)) {
          iVar9 = 0;
        }
        uVar8 = 0;
        fVar14 = 0.0;
        do {
          __x = (float)(int)uVar8 * fVar12;
          fVar11 = floorf(__x);
          iVar4 = 0;
          if (iVar3 <= (int)fVar11 + iVar9) {
            iVar4 = iVar3;
          }
          if (-1 < (int)uVar10) {
            iVar4 = 0;
          }
          iVar4 = ((int)fVar11 + iVar9) - iVar4;
          fVar13 = 0.0;
          fVar15 = 0.0;
          if (iVar4 < iVar3) {
            iVar6 = 0;
            if (iVar3 <= iVar4 + 1) {
              iVar6 = iVar3;
            }
            if (-1 < (int)uVar10) {
              iVar6 = 0;
            }
            fVar15 = *(float *)(lVar7 + (long)(iVar4 * (int)local_38) * 4);
            iVar4 = (iVar4 - iVar6) + 1;
            if (iVar4 < iVar3) {
              fVar15 = fVar15 + (*(float *)(lVar7 + (long)(iVar4 * (int)local_38) * 4) - fVar15) *
                                (__x - (float)(int)fVar11);
            }
          }
          if (uVar8 != 0) {
            fVar13 = (fVar15 - fVar14) * (1.0 / fVar12);
          }
          buffer[uVar8] = fVar13;
          uVar8 = uVar8 + 1;
          fVar14 = fVar15;
        } while ((uint)numsamples != uVar8);
      }
      goto LAB_0010ed32;
    }
  }
  memset(buffer,0,(long)numsamples << 2);
LAB_0010ed32:
  MutexScopeLock::~MutexScopeLock(&local_40);
  return 0;
}

Assistant:

int UNITY_AUDIODSP_CALLBACK GetFloatBufferCallback(UnityAudioEffectState* state, const char* name, float* buffer, int numsamples)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        if (strncmp(name, "Waveform", 8) == 0)
        {
            int usesample = (int)data->p[P_USESAMPLE];
            MutexScopeLock mutexScope(Granulator::sampleMutex, usesample >= 0);
            GranulatorSample* gs = (usesample >= 0) ? &GetGranulatorSample(usesample) : &data->delay;
            if (gs->numsamples == 0 || gs->numchannels == 0)
            {
                memset(buffer, 0, sizeof(float) * numsamples);
                return UNITY_AUDIODSP_OK;
            }
            int channel = name[8] - '0';
            if (channel >= gs->numchannels)
                channel = gs->numchannels - 1;
            int delaypos = (usesample >= 0) ? 0 : data->delaypos;
            const float* src = gs->preview + channel;
            float scale = (float)(gs->numsamples - 2) / (float)numsamples;
            float invscale = 1.0f / scale, prev = 0.0f;
            for (int n = 0; n < numsamples; n++)
            {
                float f = n * scale;
                int i = FastFloor(f);
                f -= i;
                if (gs == &data->delay)
                    i += delaypos;
                float s = 0.0f;
                if (usesample < 0 && i >= gs->numsamples)
                    i -= gs->numsamples;
                if (i < gs->numsamples)
                {
                    s = src[gs->numchannels * i++];
                    if (usesample < 0 && i >= gs->numsamples)
                        i -= gs->numsamples;
                    if (i < gs->numsamples)
                        s += (src[gs->numchannels * i] - s) * f;
                }
                buffer[n] = (n == 0) ? 0.0f : (s - prev) * invscale;
                prev = s;
            }
        }
        return UNITY_AUDIODSP_OK;
    }